

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *
tinyusdz::lerp<tinyusdz::value::texcoord2d>
          (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *a,
          vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *b,
          double t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  pointer ptVar4;
  pointer ptVar5;
  pointer ptVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  long lVar10;
  ulong __new_size;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = (long)(a->
                super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar9 <= __new_size) {
    __new_size = uVar9;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::resize
              (__return_storage_ptr__,__new_size);
    ptVar4 = (a->
             super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ptVar5 = (b->
             super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(a->
              super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar4 ==
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar5) {
      ptVar6 = (__return_storage_ptr__->
               super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        pdVar1 = (double *)((long)&ptVar4->s + lVar10);
        dVar7 = pdVar1[1];
        pdVar2 = (double *)((long)&ptVar5->s + lVar10);
        dVar8 = pdVar2[1];
        pdVar3 = (double *)((long)&ptVar6->s + lVar10);
        *pdVar3 = *pdVar2 * t + *pdVar1 * (1.0 - t);
        pdVar3[1] = dVar8 * t + dVar7 * (1.0 - t);
        lVar10 = lVar10 + 0x10;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}